

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

char * __thiscall Messages::Person::_InternalParse(Person *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ArenaStringPtr *pAVar4;
  ArenaStringPtr *pAVar5;
  bool bVar6;
  Person_PhoneNumber *msg;
  byte *pbVar7;
  Rep *pRVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  Arena *pAVar12;
  ulong uVar13;
  UnknownFieldSet *pUVar14;
  char cVar16;
  uint uVar17;
  string *psVar18;
  StringPiece SVar19;
  undefined1 auVar20 [12];
  byte *local_58;
  InternalMetadata *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  RepeatedPtrField<Messages::Person_PhoneNumber> *local_38;
  pointer pcVar15;
  
  local_58 = (byte *)ptr;
  bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  uVar10 = 0;
  if (!bVar6) {
    local_50 = (InternalMetadata *)&this->field_0x8;
    local_38 = &this->phones_;
    local_40 = &this->email_;
    local_48 = &this->name_;
    uVar10 = 0;
    do {
      bVar1 = *local_58;
      auVar20[8] = bVar1;
      auVar20._0_8_ = local_58 + 1;
      auVar20._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = local_58[1];
        uVar17 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if (-1 < (char)bVar2) {
          auVar20._8_4_ = uVar17;
          auVar20._0_8_ = local_58 + 2;
          goto LAB_00108977;
        }
        auVar20 = google::protobuf::internal::ReadTagFallback((char *)local_58,uVar17);
        if (auVar20._0_8_ != 0) goto LAB_00108977;
LAB_00108c69:
        local_58 = (byte *)0x0;
        break;
      }
LAB_00108977:
      pAVar5 = local_40;
      pAVar4 = local_48;
      uVar17 = auVar20._8_4_;
      local_58 = auVar20._0_8_;
      cVar16 = auVar20[8];
      switch(uVar17 >> 3) {
      case 1:
        if (cVar16 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar12 = *(Arena **)&this->field_0x8;
        if (((ulong)pAVar12 & 1) != 0) {
          pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
        }
        psVar18 = local_48->ptr_;
        if (psVar18 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstance
                    (local_48,pAVar12,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar18 = pAVar4->ptr_;
        }
        local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     ((string *)psVar18,(char *)local_58,ctx);
        pcVar15 = (psVar18->_M_dataplus)._M_p;
        uVar13 = psVar18->_M_string_length;
        if ((long)uVar13 < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig(uVar13,"size_t to int conversion");
        }
        pcVar9 = "Messages.Person.name";
LAB_00108aa0:
        SVar19.length_ = uVar13;
        SVar19.ptr_ = pcVar15;
        google::protobuf::internal::VerifyUTF8(SVar19,pcVar9);
        goto joined_r0x00108be3;
      case 2:
        if (cVar16 != '\x10') break;
        uVar10 = 4;
        bVar1 = *local_58;
        uVar17 = (uint)bVar1;
        pbVar7 = local_58 + 1;
        if ((char)bVar1 < '\0') {
          uVar17 = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
          if ((char)*pbVar7 < '\0') {
            auVar20 = google::protobuf::internal::VarintParseSlow64((char *)local_58,uVar17);
            local_58 = auVar20._0_8_;
            this->id_ = auVar20._8_4_;
            goto joined_r0x00108be3;
          }
          pbVar7 = local_58 + 2;
        }
        this->id_ = uVar17;
        local_58 = pbVar7;
        goto LAB_00108be9;
      case 3:
        if (cVar16 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar12 = *(Arena **)&this->field_0x8;
          if (((ulong)pAVar12 & 1) != 0) {
            pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
          }
          psVar18 = local_40->ptr_;
          if (psVar18 ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstance
                      (local_40,pAVar12,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
            ;
            psVar18 = pAVar5->ptr_;
          }
          local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       ((string *)psVar18,(char *)local_58,ctx);
          pcVar15 = (psVar18->_M_dataplus)._M_p;
          uVar13 = psVar18->_M_string_length;
          if ((long)uVar13 < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig(uVar13,"size_t to int conversion");
          }
          pcVar9 = "Messages.Person.email";
          goto LAB_00108aa0;
        }
        break;
      case 4:
        if (cVar16 == '\"') {
          local_58 = local_58 + -1;
          do {
            local_58 = local_58 + 1;
            pRVar8 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
LAB_00108ad8:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve((int)local_38);
              pRVar8 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
              iVar11 = pRVar8->allocated_size;
LAB_00108aea:
              pRVar8->allocated_size = iVar11 + 1;
              msg = google::protobuf::Arena::CreateMaybeMessage<Messages::Person_PhoneNumber>
                              ((this->phones_).super_RepeatedPtrFieldBase.arena_);
              pRVar8 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
              iVar11 = (this->phones_).super_RepeatedPtrFieldBase.current_size_;
              (this->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
              pRVar8->elements[iVar11] = msg;
            }
            else {
              iVar3 = (this->phones_).super_RepeatedPtrFieldBase.current_size_;
              iVar11 = pRVar8->allocated_size;
              if (iVar11 <= iVar3) {
                if (iVar11 == (this->phones_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00108ad8;
                goto LAB_00108aea;
              }
              (this->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (Person_PhoneNumber *)pRVar8->elements[iVar3];
            }
            local_58 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<Messages::Person_PhoneNumber>(ctx,msg,(char *)local_58);
            if (local_58 == (byte *)0x0) goto LAB_00108c69;
          } while ((local_58 < *(byte **)ctx) && (*local_58 == 0x22));
          goto LAB_00108be9;
        }
      }
      if ((uVar17 == 0) || ((uVar17 & 7) == 4)) {
        *(uint *)&ctx->field_0x50 = uVar17 - 1;
        break;
      }
      if (((ulong)local_50->ptr_ & 1) == 0) {
        pUVar14 = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_50);
      }
      else {
        pUVar14 = (UnknownFieldSet *)(((ulong)local_50->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   ((ulong)uVar17,pUVar14,(char *)local_58,ctx);
joined_r0x00108be3:
      if (local_58 == (byte *)0x0) goto LAB_00108c69;
LAB_00108be9:
      bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    } while (!bVar6);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
  return (char *)local_58;
}

Assistant:

const char* Person::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required int32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string email = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_email();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.email");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .Messages.Person.PhoneNumber phones = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_phones(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}